

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  sqlite3_vfs *psVar1;
  bool bVar2;
  sqlite3_mutex *psVar3;
  sqlite3_vfs **ppsVar4;
  sqlite3_vfs *psVar5;
  
  bVar2 = true;
  if (sqlite3Config.bCoreMutex == 0) {
LAB_00113726:
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar3 == (sqlite3_mutex *)0x0) goto LAB_00113726;
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
    bVar2 = false;
  }
  if (pVfs == (sqlite3_vfs *)0x0) goto LAB_00113769;
  if (vfsList == pVfs) {
    ppsVar4 = &vfsList;
  }
  else {
    psVar1 = vfsList;
    if (vfsList == (sqlite3_vfs *)0x0) goto LAB_00113769;
    do {
      psVar5 = psVar1;
      psVar1 = psVar5->pNext;
      if (psVar1 == (sqlite3_vfs *)0x0) break;
    } while (psVar1 != pVfs);
    if (psVar1 != pVfs) goto LAB_00113769;
    ppsVar4 = &psVar5->pNext;
  }
  *ppsVar4 = pVfs->pNext;
LAB_00113769:
  if (!bVar2) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}